

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_comp(ASMState *as,IRIns *ir)

{
  byte bVar1;
  ushort uVar2;
  MCode *pMVar3;
  IRIns *pIVar4;
  uint uVar5;
  IRRef ref;
  ushort uVar6;
  Reg RVar7;
  Reg RVar8;
  Reg RVar9;
  int iVar10;
  MCode *pMVar11;
  ulong uVar12;
  ushort uVar13;
  uint uVar14;
  anon_struct_8_5_4e98db7e_for_IRIns_2 aVar15;
  char cVar16;
  x86Op xVar17;
  IRType1 origt;
  uint uVar18;
  RegSet allow;
  IRIns *pIVar19;
  bool bVar20;
  bool bVar21;
  uint local_4c;
  IRIns *local_48;
  uint local_3c;
  anon_struct_8_5_4e98db7e_for_IRIns_2 local_38;
  
  uVar18 = (uint)asm_compmap[(ir->field_1).o];
  uVar14 = (ir->field_1).t.irt & 0x1f;
  uVar13 = (ir->field_0).op2;
  if (uVar14 != 0xe) {
    uVar2 = (ir->field_0).op1;
    pIVar4 = as->ir;
    local_4c = 0;
    if ((-1 < (short)uVar2) ||
       ((uVar6 = uVar2, (short)uVar13 < 0 &&
        ((byte)(*(char *)((long)pIVar4 + (ulong)uVar2 * 8 + 5) + 0xbeU) < 7)))) {
      uVar6 = uVar13;
      uVar13 = uVar2;
      if ((~uVar18 & 0xc) == 0) {
        uVar18 = uVar18 ^ 0x53;
      }
      else if ((uVar18 & 10) == 2) {
        uVar18 = uVar18 ^ 0x55;
      }
    }
    RVar7 = -(uint)((0x605fd9U >> uVar14 & 1) != 0) & 0x80200;
    if ((short)uVar13 < 0) {
LAB_0013d53e:
      bVar1 = *(byte *)((long)pIVar4 + (ulong)uVar6 * 8 + 6);
      RVar9 = (Reg)bVar1;
      if ((char)bVar1 < '\0') {
        RVar9 = ra_allocref(as,(uint)uVar6,0xbfef);
      }
      bVar1 = (byte)RVar9 & 0x1f;
      as->weakset = as->weakset & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
      RVar8 = asm_fuseloadm(as,(uint)uVar13,~(1 << (RVar9 & 0x1f)) & 0xbfef,RVar7);
      asm_guardcc(as,uVar18);
      RVar9 = RVar9 | RVar7;
      xVar17 = XO_CMP;
      goto LAB_0013d753;
    }
    uVar12 = (ulong)(uint)uVar13;
    if ((*(char *)((long)pIVar4 + uVar12 * 8 + 5) == '\x1b') ||
       ((0x605fd9U >> (*(uint *)((long)pIVar4 + uVar12 * 8 + 4) & 0x1f) & 1) == 0)) {
      aVar15.t.irt = '\0';
      aVar15.o = '\0';
      aVar15.r = '\0';
      aVar15.s = '\0';
      aVar15.op12 = pIVar4[uVar12].field_1.op12;
    }
    else {
      aVar15 = pIVar4[uVar12 + 1].field_1;
      if ((anon_struct_8_5_4e98db7e_for_IRIns_2)(long)(int)aVar15.op12 != aVar15) goto LAB_0013d53e;
    }
    local_4c = aVar15.op12;
    pIVar19 = pIVar4 + uVar6;
    bVar20 = local_4c == 0;
    bVar21 = (uVar18 & 10) != 2;
    local_48 = pIVar19;
    if ((((bVar21 && bVar20) && (pIVar19 + 1 == ir && (pIVar19->field_1).o == '!')) &&
        ((char)(pIVar19->field_1).r < '\0')) && ((pIVar19->field_1).s == '\0')) {
      uVar13 = (pIVar19->field_0).op2;
      iVar10 = asm_isk32(as,(uint)uVar13,(int32_t *)&local_4c);
      if (iVar10 == 0) {
        RVar9 = ra_alloc1(as,(uint)uVar13,0xbfef);
        allow = ~(1 << (RVar9 & 0x1f)) & 0xbfef;
      }
      else {
        uVar12 = (ulong)(pIVar19->field_0).op1;
        iVar10 = 0;
        if (((byte)(*(char *)((long)pIVar4 + uVar12 * 8 + 5) + 0xbeU) < 7) &&
           (bVar1 = *(byte *)((long)pIVar4 + uVar12 * 8 + 4), (byte)((bVar1 & 0x1f) - 0xf) < 2)) {
          *(byte *)((long)pIVar4 + uVar12 * 8 + 4) = bVar1 & 0xe0 | 0x13;
          as->curins = as->curins - 1;
          RVar9 = asm_fuseload(as,(uint)(local_48->field_0).op1,0xbfef);
          as->curins = as->curins + 1;
          pIVar19 = (IRIns *)(ulong)RVar9;
          *(byte *)((long)pIVar4 + uVar12 * 8 + 4) = bVar1;
          iVar10 = 2;
          if (RVar9 == 0x20) {
            asm_guardcc(as,uVar18);
            pMVar3 = as->mcp;
            as->mcp = pMVar3 + -1;
            pMVar3[-1] = (MCode)local_4c;
            emit_mrm(as,XO_GROUP3b,0,0x20);
            iVar10 = 1;
          }
        }
        RVar8 = (Reg)pIVar19;
        RVar9 = 0x80;
        if (iVar10 == 2) goto LAB_0013d89e;
        allow = 0xbfef;
        if (iVar10 != 0) {
          return;
        }
      }
      as->curins = as->curins - 1;
      RVar8 = asm_fuseloadm(as,(uint)(local_48->field_0).op1,allow,RVar7);
      as->curins = as->curins + 1;
LAB_0013d89e:
      asm_guardcc(as,uVar18);
      if ((char)RVar9 < '\0') {
        pMVar3 = as->mcp;
        *(uint *)(pMVar3 + -4) = local_4c;
        as->mcp = pMVar3 + -4;
        xVar17 = XO_GROUP3;
      }
      else {
        RVar7 = RVar9 + RVar7;
        xVar17 = XO_TEST;
      }
      emit_mrm(as,xVar17,RVar7,RVar8);
      return;
    }
    local_38 = aVar15;
    if (6 < (byte)((pIVar19->field_1).o + 0xbe)) goto LAB_0013d66a;
    bVar1 = (byte)(pIVar19->field_0).ot;
    uVar14 = bVar1 & 0x1f;
    cVar16 = (char)uVar14;
    if ((local_4c < 0x100) && (cVar16 == '\x10')) {
LAB_0013d461:
      (pIVar19->field_1).t.irt = bVar1 & 0xe0 | 0x13;
      local_3c = (uint)bVar1;
      RVar8 = asm_fuseload(as,(uint)uVar6,0xbfef);
      (pIVar19->field_1).t.irt = (uint8_t)local_3c;
      if (RVar8 == 0x20) {
        if ((uVar14 | 2) == 0x12) {
          uVar18 = uVar18 >> 4;
        }
        asm_guardcc(as,uVar18);
        pMVar3 = as->mcp;
        as->mcp = pMVar3 + -1;
        pMVar3[-1] = (MCode)local_38.op12;
        xVar17 = XO_ARITHiw8;
        if ((byte)(cVar16 - 0xfU) < 2) {
          xVar17 = XO_ARITHib;
        }
        emit_mrm(as,xVar17,RVar7 | 7,0x20);
      }
      if (RVar8 == 0x20) {
        return;
      }
    }
    else {
      if (uVar14 == 0xf) {
LAB_0013d5b8:
        if ((int)(char)aVar15.op12 == local_4c) goto LAB_0013d461;
        if ((local_4c < 0x10000) && (cVar16 == '\x12')) {
LAB_0013d65c:
          if ((int)(short)aVar15.op12 == (int)(char)aVar15.op12) goto LAB_0013d461;
        }
      }
      else if (uVar14 == 0x12) {
        if (local_4c < 0x10000) goto LAB_0013d65c;
      }
      else if (uVar14 == 0x11) goto LAB_0013d5b8;
LAB_0013d66a:
      RVar8 = asm_fuseloadm(as,(uint)uVar6,0xbfef,RVar7);
    }
    asm_guardcc(as,uVar18);
    if ((bVar21 && bVar20) && RVar8 != 0x20) {
      bVar20 = ((ir->field_1).t.irt & 0x1f) != 0x10;
      uVar18 = 0;
      if (!bVar20) {
        uVar18 = ~(0x1e00U >> ((byte)RVar8 & 0x1f)) & 0x200;
      }
      emit_rr(as,(uint)bVar20 << 0x18 | XO_TESTb,RVar7 + (uVar18 | RVar8),uVar18 | RVar8);
      if (local_48 + 1 != ir) {
        return;
      }
      as->flagmcp = as->mcp;
      return;
    }
    if ((int)(char)(MCode)local_38.op12 == local_38.op12) {
      pMVar3 = as->mcp;
      as->mcp = pMVar3 + -1;
      pMVar3[-1] = (MCode)local_38.op12;
      xVar17 = XO_ARITHi8;
    }
    else {
      pMVar3 = as->mcp;
      *(IRRef2 *)(pMVar3 + -4) = local_38.op12;
      as->mcp = pMVar3 + -4;
      xVar17 = XO_ARITHi;
    }
    RVar9 = RVar8 + RVar7 & 0x80200 | 7;
    RVar8 = RVar8 + RVar7 & 0xfff7fdff;
LAB_0013d753:
    emit_mrm(as,xVar17,RVar9,RVar8);
    return;
  }
  bVar20 = (asm_compmap[(ir->field_1).o] >> 0xe & 1) == 0;
  uVar14 = (uint)uVar13;
  ref = (uint)(ir->field_0).op1;
  if (bVar20) {
    uVar14 = (uint)(ir->field_0).op1;
    ref = (uint)uVar13;
  }
  uVar5 = uVar18 ^ 0x6050;
  if (bVar20) {
    uVar5 = uVar18;
  }
  bVar1 = *(byte *)((long)as->ir + (ulong)uVar14 * 8 + 6);
  RVar7 = (Reg)bVar1;
  if ((char)bVar1 < '\0') {
    RVar7 = ra_allocref(as,uVar14,0xffff0000);
  }
  bVar1 = (byte)RVar7 & 0x1f;
  as->weakset = as->weakset & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
  pMVar3 = as->mcp;
  asm_guardcc(as,uVar5 >> 4);
  if ((uVar5 >> 0xd & 1) == 0) goto LAB_0013d60a;
  if ((uVar5 >> 0xc & 1) == 0) {
    asm_guardcc(as,10);
    goto LAB_0013d60a;
  }
  if (pMVar3 == as->invmcp) {
    as->loopinv = 2;
    pMVar11 = as->mcp;
    if (as->realign != (MCode *)0x0) {
      pMVar11[-2] = 'z';
      pMVar11[-1] = '\0';
      goto LAB_0013d5ff;
    }
    pMVar11[-4] = '\0';
    pMVar11[-3] = '\0';
    pMVar11[-2] = '\0';
    pMVar11[-1] = '\0';
    pMVar11[-6] = '\x0f';
    pMVar11[-5] = 0x8a;
    pMVar11 = pMVar11 + -6;
  }
  else {
    pMVar11 = as->mcp;
    pMVar11[-1] = (char)pMVar3 - (char)pMVar11;
    pMVar11[-2] = 'z';
LAB_0013d5ff:
    pMVar11 = pMVar11 + -2;
  }
  as->mcp = pMVar11;
LAB_0013d60a:
  RVar9 = asm_fuseload(as,ref,~(1 << ((byte)RVar7 & 0x1f)) & 0xffff0000);
  emit_mrm(as,XO_UCOMISD,RVar7,RVar9);
  return;
}

Assistant:

static void asm_comp(ASMState *as, IRIns *ir)
{
  uint32_t cc = asm_compmap[ir->o];
  if (irt_isnum(ir->t)) {
    IRRef lref = ir->op1;
    IRRef rref = ir->op2;
    Reg left, right;
    MCLabel l_around;
    /*
    ** An extra CC_P branch is required to preserve ordered/unordered
    ** semantics for FP comparisons. This can be avoided by swapping
    ** the operands and inverting the condition (except for EQ and UNE).
    ** So always try to swap if possible.
    **
    ** Another option would be to swap operands to achieve better memory
    ** operand fusion. But it's unlikely that this outweighs the cost
    ** of the extra branches.
    */
    if (cc & VCC_S) {  /* Swap? */
      IRRef tmp = lref; lref = rref; rref = tmp;
      cc ^= (VCC_PS|(5<<4));  /* A <-> B, AE <-> BE, PS <-> none */
    }
    left = ra_alloc1(as, lref, RSET_FPR);
    l_around = emit_label(as);
    asm_guardcc(as, cc >> 4);
    if (cc & VCC_P) {  /* Extra CC_P branch required? */
      if (!(cc & VCC_U)) {
	asm_guardcc(as, CC_P);  /* Branch to exit for ordered comparisons. */
      } else if (l_around != as->invmcp) {
	emit_sjcc(as, CC_P, l_around);  /* Branch around for unordered. */
      } else {
	/* Patched to mcloop by asm_loop_fixup. */
	as->loopinv = 2;
	if (as->realign)
	  emit_sjcc(as, CC_P, as->mcp);
	else
	  emit_jcc(as, CC_P, as->mcp);
      }
    }
    right = asm_fuseload(as, rref, rset_exclude(RSET_FPR, left));
    emit_mrm(as, XO_UCOMISD, left, right);
  } else {
    IRRef lref = ir->op1, rref = ir->op2;
    IROp leftop = (IROp)(IR(lref)->o);
    Reg r64 = REX_64IR(ir, 0);
    int32_t imm = 0;
    lj_assertA(irt_is64(ir->t) || irt_isint(ir->t) ||
	       irt_isu32(ir->t) || irt_isaddr(ir->t) || irt_isu8(ir->t),
	       "bad comparison data type %d", irt_type(ir->t));
    /* Swap constants (only for ABC) and fusable loads to the right. */
    if (irref_isk(lref) || (!irref_isk(rref) && opisfusableload(leftop))) {
      if ((cc & 0xc) == 0xc) cc ^= 0x53;  /* L <-> G, LE <-> GE */
      else if ((cc & 0xa) == 0x2) cc ^= 0x55;  /* A <-> B, AE <-> BE */
      lref = ir->op2; rref = ir->op1;
    }
    if (asm_isk32(as, rref, &imm)) {
      IRIns *irl = IR(lref);
      /* Check wether we can use test ins. Not for unsigned, since CF=0. */
      int usetest = (imm == 0 && (cc & 0xa) != 0x2);
      if (usetest && irl->o == IR_BAND && irl+1 == ir && !ra_used(irl)) {
	/* Combine comp(BAND(ref, r/imm), 0) into test mrm, r/imm. */
	Reg right, left = RID_NONE;
	RegSet allow = RSET_GPR;
	if (!asm_isk32(as, irl->op2, &imm)) {
	  left = ra_alloc1(as, irl->op2, allow);
	  rset_clear(allow, left);
	} else {  /* Try to Fuse IRT_I8/IRT_U8 loads, too. See below. */
	  IRIns *irll = IR(irl->op1);
	  if (opisfusableload((IROp)irll->o) &&
	      (irt_isi8(irll->t) || irt_isu8(irll->t))) {
	    IRType1 origt = irll->t;  /* Temporarily flip types. */
	    irll->t.irt = (irll->t.irt & ~IRT_TYPE) | IRT_INT;
	    as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	    right = asm_fuseload(as, irl->op1, RSET_GPR);
	    as->curins++;
	    irll->t = origt;
	    if (right != RID_MRM) goto test_nofuse;
	    /* Fusion succeeded, emit test byte mrm, imm8. */
	    asm_guardcc(as, cc);
	    emit_i8(as, (imm & 0xff));
	    emit_mrm(as, XO_GROUP3b, XOg_TEST, RID_MRM);
	    return;
	  }
	}
	as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	right = asm_fuseloadm(as, irl->op1, allow, r64);
	as->curins++;  /* Undo the above. */
      test_nofuse:
	asm_guardcc(as, cc);
	if (ra_noreg(left)) {
	  emit_i32(as, imm);
	  emit_mrm(as, XO_GROUP3, r64 + XOg_TEST, right);
	} else {
	  emit_mrm(as, XO_TEST, r64 + left, right);
	}
      } else {
	Reg left;
	if (opisfusableload((IROp)irl->o) &&
	    ((irt_isu8(irl->t) && checku8(imm)) ||
	     ((irt_isi8(irl->t) || irt_isi16(irl->t)) && checki8(imm)) ||
	     (irt_isu16(irl->t) && checku16(imm) && checki8((int16_t)imm)))) {
	  /* Only the IRT_INT case is fused by asm_fuseload.
	  ** The IRT_I8/IRT_U8 loads and some IRT_I16/IRT_U16 loads
	  ** are handled here.
	  ** Note that cmp word [mem], imm16 should not be generated,
	  ** since it has a length-changing prefix. Compares of a word
	  ** against a sign-extended imm8 are ok, however.
	  */
	  IRType1 origt = irl->t;  /* Temporarily flip types. */
	  irl->t.irt = (irl->t.irt & ~IRT_TYPE) | IRT_INT;
	  left = asm_fuseload(as, lref, RSET_GPR);
	  irl->t = origt;
	  if (left == RID_MRM) {  /* Fusion succeeded? */
	    if (irt_isu8(irl->t) || irt_isu16(irl->t))
	      cc >>= 4;  /* Need unsigned compare. */
	    asm_guardcc(as, cc);
	    emit_i8(as, imm);
	    emit_mrm(as, (irt_isi8(origt) || irt_isu8(origt)) ?
			 XO_ARITHib : XO_ARITHiw8, r64 + XOg_CMP, RID_MRM);
	    return;
	  }  /* Otherwise handle register case as usual. */
	} else {
	  left = asm_fuseloadm(as, lref,
			       irt_isu8(ir->t) ? RSET_GPR8 : RSET_GPR, r64);
	}
	asm_guardcc(as, cc);
	if (usetest && left != RID_MRM) {
	  /* Use test r,r instead of cmp r,0. */
	  x86Op xo = XO_TEST;
	  if (irt_isu8(ir->t)) {
	    lj_assertA(ir->o == IR_EQ || ir->o == IR_NE, "bad usage");
	    xo = XO_TESTb;
	    if (!rset_test(RSET_RANGE(RID_EAX, RID_EBX+1), left)) {
	      if (LJ_64) {
		left |= FORCE_REX;
	      } else {
		emit_i32(as, 0xff);
		emit_mrm(as, XO_GROUP3, XOg_TEST, left);
		return;
	      }
	    }
	  }
	  emit_rr(as, xo, r64 + left, left);
	  if (irl+1 == ir)  /* Referencing previous ins? */
	    as->flagmcp = as->mcp;  /* Set flag to drop test r,r if possible. */
	} else {
	  emit_gmrmi(as, XG_ARITHi(XOg_CMP), r64 + left, imm);
	}
      }
    } else {
      Reg left = ra_alloc1(as, lref, RSET_GPR);
      Reg right = asm_fuseloadm(as, rref, rset_exclude(RSET_GPR, left), r64);
      asm_guardcc(as, cc);
      emit_mrm(as, XO_CMP, r64 + left, right);
    }
  }
}